

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

BBox3fa * __thiscall
embree::SceneGraph::Transformations::bounds
          (BBox3fa *__return_storage_ptr__,Transformations *this,BBox3fa *cbounds)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  size_t sVar20;
  Vector *pVVar21;
  BBox3fa *r;
  bool bVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar39;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  
  sVar20 = (this->spaces).size_active;
  fVar15 = (cbounds->lower).field_0.m128[0];
  fVar16 = (cbounds->lower).field_0.m128[1];
  fVar17 = (cbounds->lower).field_0.m128[2];
  fVar18 = (cbounds->upper).field_0.m128[1];
  fVar1 = (cbounds->upper).field_0.m128[2];
  fVar19 = (cbounds->upper).field_0.m128[0];
  pVVar21 = &((this->spaces).items)->p;
  aVar39 = _DAT_0021cc10;
  aVar40 = _DAT_0021cc00;
  while (bVar22 = sVar20 != 0, sVar20 = sVar20 - 1, bVar22) {
    fVar27 = (((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)(pVVar21 + -3))->l).vx.field_0
             .m128[0];
    fVar28 = (((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)(pVVar21 + -3))->l).vx.field_0
             .m128[1];
    fVar29 = (((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)(pVVar21 + -3))->l).vx.field_0
             .m128[2];
    fVar30 = (((AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)(pVVar21 + -3))->l).vx.field_0
             .m128[3];
    fVar49 = pVVar21[-1].field_0.m128[0] * fVar17 + (pVVar21->field_0).m128[0];
    fVar50 = pVVar21[-1].field_0.m128[1] * fVar17 + (pVVar21->field_0).m128[1];
    fVar51 = pVVar21[-1].field_0.m128[2] * fVar17 + (pVVar21->field_0).m128[2];
    fVar52 = pVVar21[-1].field_0.m128[3] * fVar17 + (pVVar21->field_0).m128[3];
    fVar56 = pVVar21[-2].field_0.m128[0] * fVar16;
    fVar57 = pVVar21[-2].field_0.m128[1] * fVar16;
    fVar58 = pVVar21[-2].field_0.m128[2] * fVar16;
    fVar59 = pVVar21[-2].field_0.m128[3] * fVar16;
    fVar31 = fVar56 + fVar49;
    fVar32 = fVar57 + fVar50;
    fVar33 = fVar58 + fVar51;
    fVar34 = fVar59 + fVar52;
    fVar23 = fVar27 * fVar15;
    fVar24 = fVar28 * fVar15;
    fVar25 = fVar29 * fVar15;
    fVar26 = fVar30 * fVar15;
    fVar41 = fVar23 + fVar31;
    fVar42 = fVar24 + fVar32;
    fVar43 = fVar25 + fVar33;
    fVar44 = fVar26 + fVar34;
    auVar9._4_4_ = fVar42;
    auVar9._0_4_ = fVar41;
    auVar9._8_4_ = fVar43;
    auVar9._12_4_ = fVar44;
    auVar53 = minps((undefined1  [16])_DAT_0021cc00,auVar9);
    auVar10._4_4_ = fVar42;
    auVar10._0_4_ = fVar41;
    auVar10._8_4_ = fVar43;
    auVar10._12_4_ = fVar44;
    auVar54 = maxps((undefined1  [16])_DAT_0021cc10,auVar10);
    fVar35 = pVVar21[-1].field_0.m128[0] * fVar1 + (pVVar21->field_0).m128[0];
    fVar36 = pVVar21[-1].field_0.m128[1] * fVar1 + (pVVar21->field_0).m128[1];
    fVar37 = pVVar21[-1].field_0.m128[2] * fVar1 + (pVVar21->field_0).m128[2];
    fVar38 = pVVar21[-1].field_0.m128[3] * fVar1 + (pVVar21->field_0).m128[3];
    fVar56 = fVar56 + fVar35;
    fVar57 = fVar57 + fVar36;
    fVar58 = fVar58 + fVar37;
    fVar59 = fVar59 + fVar38;
    fVar41 = fVar23 + fVar56;
    fVar42 = fVar24 + fVar57;
    fVar43 = fVar25 + fVar58;
    fVar44 = fVar26 + fVar59;
    auVar55._4_4_ = fVar42;
    auVar55._0_4_ = fVar41;
    auVar55._8_4_ = fVar43;
    auVar55._12_4_ = fVar44;
    auVar53 = minps(auVar53,auVar55);
    auVar2._4_4_ = fVar42;
    auVar2._0_4_ = fVar41;
    auVar2._8_4_ = fVar43;
    auVar2._12_4_ = fVar44;
    auVar55 = maxps(auVar54,auVar2);
    fVar45 = pVVar21[-2].field_0.m128[0] * fVar18;
    fVar46 = pVVar21[-2].field_0.m128[1] * fVar18;
    fVar47 = pVVar21[-2].field_0.m128[2] * fVar18;
    fVar48 = pVVar21[-2].field_0.m128[3] * fVar18;
    fVar49 = fVar49 + fVar45;
    fVar50 = fVar50 + fVar46;
    fVar51 = fVar51 + fVar47;
    fVar52 = fVar52 + fVar48;
    fVar41 = fVar23 + fVar49;
    fVar42 = fVar24 + fVar50;
    fVar43 = fVar25 + fVar51;
    fVar44 = fVar26 + fVar52;
    auVar3._4_4_ = fVar42;
    auVar3._0_4_ = fVar41;
    auVar3._8_4_ = fVar43;
    auVar3._12_4_ = fVar44;
    auVar54 = minps(auVar53,auVar3);
    auVar4._4_4_ = fVar42;
    auVar4._0_4_ = fVar41;
    auVar4._8_4_ = fVar43;
    auVar4._12_4_ = fVar44;
    auVar55 = maxps(auVar55,auVar4);
    fVar45 = fVar45 + fVar35;
    fVar46 = fVar46 + fVar36;
    fVar47 = fVar47 + fVar37;
    fVar48 = fVar48 + fVar38;
    fVar23 = fVar23 + fVar45;
    fVar24 = fVar24 + fVar46;
    fVar25 = fVar25 + fVar47;
    fVar26 = fVar26 + fVar48;
    auVar53._4_4_ = fVar24;
    auVar53._0_4_ = fVar23;
    auVar53._8_4_ = fVar25;
    auVar53._12_4_ = fVar26;
    auVar53 = minps(auVar54,auVar53);
    auVar54._4_4_ = fVar24;
    auVar54._0_4_ = fVar23;
    auVar54._8_4_ = fVar25;
    auVar54._12_4_ = fVar26;
    auVar54 = maxps(auVar55,auVar54);
    fVar27 = fVar27 * fVar19;
    fVar28 = fVar28 * fVar19;
    fVar29 = fVar29 * fVar19;
    fVar30 = fVar30 * fVar19;
    fVar31 = fVar31 + fVar27;
    fVar32 = fVar32 + fVar28;
    fVar33 = fVar33 + fVar29;
    fVar34 = fVar34 + fVar30;
    auVar7._4_4_ = fVar32;
    auVar7._0_4_ = fVar31;
    auVar7._8_4_ = fVar33;
    auVar7._12_4_ = fVar34;
    auVar53 = minps(auVar53,auVar7);
    auVar8._4_4_ = fVar32;
    auVar8._0_4_ = fVar31;
    auVar8._8_4_ = fVar33;
    auVar8._12_4_ = fVar34;
    auVar54 = maxps(auVar54,auVar8);
    fVar56 = fVar56 + fVar27;
    fVar57 = fVar57 + fVar28;
    fVar58 = fVar58 + fVar29;
    fVar59 = fVar59 + fVar30;
    auVar13._4_4_ = fVar57;
    auVar13._0_4_ = fVar56;
    auVar13._8_4_ = fVar58;
    auVar13._12_4_ = fVar59;
    auVar53 = minps(auVar53,auVar13);
    auVar14._4_4_ = fVar57;
    auVar14._0_4_ = fVar56;
    auVar14._8_4_ = fVar58;
    auVar14._12_4_ = fVar59;
    auVar54 = maxps(auVar54,auVar14);
    fVar49 = fVar49 + fVar27;
    fVar50 = fVar50 + fVar28;
    fVar51 = fVar51 + fVar29;
    fVar52 = fVar52 + fVar30;
    auVar11._4_4_ = fVar50;
    auVar11._0_4_ = fVar49;
    auVar11._8_4_ = fVar51;
    auVar11._12_4_ = fVar52;
    auVar53 = minps(auVar53,auVar11);
    auVar12._4_4_ = fVar50;
    auVar12._0_4_ = fVar49;
    auVar12._8_4_ = fVar51;
    auVar12._12_4_ = fVar52;
    auVar54 = maxps(auVar54,auVar12);
    fVar27 = fVar27 + fVar45;
    fVar28 = fVar28 + fVar46;
    fVar29 = fVar29 + fVar47;
    fVar30 = fVar30 + fVar48;
    auVar5._4_4_ = fVar28;
    auVar5._0_4_ = fVar27;
    auVar5._8_4_ = fVar29;
    auVar5._12_4_ = fVar30;
    auVar53 = minps(auVar53,auVar5);
    auVar6._4_4_ = fVar28;
    auVar6._0_4_ = fVar27;
    auVar6._8_4_ = fVar29;
    auVar6._12_4_ = fVar30;
    auVar54 = maxps(auVar54,auVar6);
    aVar40.m128 = (__m128)minps(aVar40.m128,auVar53);
    aVar39.m128 = (__m128)maxps(aVar39.m128,auVar54);
    pVVar21 = pVVar21 + 4;
  }
  (__return_storage_ptr__->lower).field_0 = aVar40;
  (__return_storage_ptr__->upper).field_0 = aVar39;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa bounds ( const BBox3fa& cbounds ) const 
      {
        BBox3fa r = empty;
        for (size_t i=0; i<spaces.size(); i++)
          r.extend(xfmBounds(spaces[i],cbounds));
        return r;
      }